

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_avx512::create_pipeline(Convolution1D_x86_avx512 *this,Option *opt)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined4 *puVar12;
  int i;
  ulong uVar13;
  uint _h;
  long lVar14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  undefined8 in_R11;
  undefined4 uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  undefined4 *puVar22;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ulong local_d8;
  Mat local_78;
  uint uVar23;
  uint uVar26;
  
  uVar18 = (undefined4)((ulong)in_R11 >> 0x20);
  p_Var1 = this->_vptr_Convolution1D_x86_avx512[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var1) == 0) {
    uVar10 = (long)*(int *)(&this->field_0xf0 + (long)p_Var1) /
             (long)*(int *)(&this->field_0xd4 + (long)p_Var1);
    uVar10 = (long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
             (long)*(int *)(&this->field_0xd0 + (long)p_Var1);
    _h = (uint)uVar10;
    if (opt->use_packing_layout == true) {
      auVar24 = vpinsrd_avx(ZEXT416(_h),*(int *)(&this->field_0xd0 + (long)p_Var1),1);
      auVar25._8_4_ = 7;
      auVar25._0_8_ = 0x700000007;
      auVar25._12_4_ = 7;
      uVar20 = vptestnmd_avx512vl(auVar24,auVar25);
      auVar11._8_4_ = 3;
      auVar11._0_8_ = 0x300000003;
      auVar11._12_4_ = 3;
      uVar19 = vptestnmd_avx512vl(auVar24,auVar11);
      auVar24 = vpbroadcastd_avx512vl(ZEXT416(4));
      bVar7 = (bool)((byte)(uVar19 & 0xf) & 1);
      bVar9 = (bool)((byte)((uVar19 & 0xf) >> 1) & 1);
      auVar25 = vpbroadcastd_avx512vl(ZEXT416(8));
      bVar8 = (bool)((byte)(uVar20 & 0xf) & 1);
      uVar23 = (uint)bVar8 * auVar25._0_4_ |
               (uint)!bVar8 * ((uint)bVar7 * auVar24._0_4_ | (uint)!bVar7);
      bVar7 = (bool)((byte)((uVar20 & 0xf) >> 1) & 1);
      uVar26 = (uint)bVar7 * auVar25._4_4_ |
               (uint)!bVar7 * ((uint)bVar9 * auVar24._4_4_ | (uint)!bVar9);
    }
    else {
      uVar23 = 1;
      uVar26 = 1;
    }
    p_Var1 = this->_vptr_Convolution1D_x86_avx512[-3];
    Mat::reshape(&local_78,(Mat *)(&this->field_0x148 + (long)p_Var1),
                 *(int *)(&this->field_0xd4 + (long)p_Var1),_h,
                 *(int *)(&this->field_0xd0 + (long)p_Var1),(Allocator *)0x0);
    uVar20 = (ulong)uVar26;
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86_avx512[-3]),
                (int)((long)((ulong)(uint)((int)_h >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
                     (long)(int)uVar23),
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx512[-3]) /
                (int)uVar26,uVar20 * CONCAT44(uVar18,uVar23) * 4,uVar26 * uVar23,(Allocator *)0x0);
    pp_Var2 = this->_vptr_Convolution1D_x86_avx512;
    if ((int)uVar26 <= *(int *)(&this->field_0xd0 + (long)pp_Var2[-3])) {
      pp_Var3 = this->_vptr_Convolution1D_x86_avx512;
      pvVar4 = (this->weight_data_packed).data;
      sVar5 = (this->weight_data_packed).cstep;
      sVar6 = (this->weight_data_packed).elemsize;
      uVar10 = (ulong)uVar23;
      local_d8 = 0;
      do {
        if ((int)uVar23 <= (int)_h) {
          puVar12 = (undefined4 *)
                    ((long)(int)((local_d8 & 0xffffffff) / uVar20) * sVar5 * sVar6 + (long)pvVar4);
          puVar22 = (undefined4 *)
                    (local_78.cstep * local_78.elemsize * local_d8 + (long)local_78.data);
          lVar14 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3])) {
              lVar21 = 0;
              puVar15 = puVar22;
              do {
                uVar13 = 0;
                puVar17 = puVar15;
                uVar19 = uVar20;
                puVar16 = puVar15;
                do {
                  do {
                    *puVar12 = *puVar17;
                    puVar12 = puVar12 + 1;
                    uVar19 = uVar19 - 1;
                    puVar17 = (undefined4 *)((long)puVar17 + local_78.cstep * local_78.elemsize);
                  } while (uVar19 != 0);
                  uVar13 = uVar13 + 1;
                  puVar17 = (undefined4 *)((long)puVar16 + (long)local_78.w * local_78.elemsize);
                  uVar19 = uVar20;
                  puVar16 = puVar17;
                } while (uVar13 != uVar10);
                lVar21 = lVar21 + 1;
                puVar15 = puVar15 + 1;
              } while (lVar21 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3]));
            }
            lVar14 = lVar14 + uVar10;
            puVar22 = (undefined4 *)((long)puVar22 + (long)local_78.w * local_78.elemsize * uVar10);
          } while (lVar14 < (long)((long)(int)_h - (ulong)(uVar23 - 1)));
        }
        local_d8 = local_d8 + uVar20;
      } while ((long)((uVar26 - 1) + local_d8) <
               (long)*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]));
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution1D_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}